

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

void * Curl_ssl_get_internals(Curl_easy *data,int sockindex,CURLINFO info,int n)

{
  long *plVar1;
  long lVar2;
  void *pvVar3;
  Curl_cfilter *pCVar4;
  
  if (data->conn != (connectdata *)0x0) {
    for (pCVar4 = data->conn->cfilter[sockindex]; pCVar4 != (Curl_cfilter *)0x0;
        pCVar4 = pCVar4->next) {
      if ((pCVar4->cft == &Curl_cft_ssl) || (pCVar4->cft == &Curl_cft_ssl_proxy)) goto LAB_00176c7f;
    }
    pCVar4 = (Curl_cfilter *)0x0;
LAB_00176c7f:
    if (pCVar4 != (Curl_cfilter *)0x0) {
      plVar1 = (long *)pCVar4->ctx;
      lVar2 = plVar1[9];
      plVar1[9] = (long)data;
      pvVar3 = (void *)(**(code **)(*plVar1 + 0x68))(plVar1,info);
      *(long *)((long)pCVar4->ctx + 0x48) = lVar2;
      return pvVar3;
    }
  }
  return (void *)0x0;
}

Assistant:

void *Curl_ssl_get_internals(struct Curl_easy *data, int sockindex,
                             CURLINFO info, int n)
{
  void *result = NULL;
  (void)n;
  if(data->conn) {
    struct Curl_cfilter *cf;
    /* get first SSL filter in chain, if any is present */
    cf = get_ssl_filter(data->conn->cfilter[sockindex]);
    if(cf) {
      struct ssl_connect_data *connssl = cf->ctx;
      struct cf_call_data save;
      CF_DATA_SAVE(save, cf, data);
      result = connssl->ssl_impl->get_internals(cf->ctx, info);
      CF_DATA_RESTORE(cf, save);
    }
  }
  return result;
}